

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_hdu_clear(NGP_HDU *ngph)

{
  char *pcVar1;
  NGP_TOKEN *__ptr;
  long lVar2;
  long lVar3;
  
  if (ngph != (NGP_HDU *)0x0) {
    lVar2 = 0x50;
    for (lVar3 = 0; __ptr = ngph->tok, lVar3 < ngph->tokcnt; lVar3 = lVar3 + 1) {
      if ((*(int *)(__ptr->name + lVar2 + -0x54) == 2) &&
         (*(void **)(__ptr->name + lVar2 + -4) != (void *)0x0)) {
        free(*(void **)(__ptr->name + lVar2 + -4));
        pcVar1 = ngph->tok->name + lVar2 + -4;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      lVar2 = lVar2 + 0xb0;
    }
    free(__ptr);
    ngph->tok = (NGP_TOKEN *)0x0;
    ngph->tokcnt = 0;
    return 0;
  }
  return 0x16a;
}

Assistant:

int	ngp_hdu_clear(NGP_HDU *ngph)
 { int i;

   if (NULL == ngph) return(NGP_NUL_PTR);

   for (i=0; i<ngph->tokcnt; i++)
    { if (NGP_TTYPE_STRING == ngph->tok[i].type)
        if (NULL != ngph->tok[i].value.s)
          { ngp_free(ngph->tok[i].value.s);
            ngph->tok[i].value.s = NULL;
          }
    }

   if (NULL != ngph->tok) ngp_free(ngph->tok);

   ngph->tok = NULL;
   ngph->tokcnt = 0;

   return(NGP_OK);
 }